

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O0

ngx_int_t ngx_add_path(ngx_conf_t *cf,ngx_path_t **slot)

{
  ngx_path_t *pnVar1;
  void *pvVar2;
  int iVar3;
  long *plVar4;
  ngx_path_t **p;
  ngx_path_t *path;
  ngx_uint_t n;
  ngx_uint_t i;
  ngx_path_t **slot_local;
  ngx_conf_t *cf_local;
  
  pnVar1 = *slot;
  pvVar2 = (cf->cycle->paths).elts;
  n = 0;
  while( true ) {
    if ((cf->cycle->paths).nelts <= n) {
      plVar4 = (long *)ngx_array_push(&cf->cycle->paths);
      if (plVar4 == (long *)0x0) {
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
      else {
        *plVar4 = (long)pnVar1;
        cf_local = (ngx_conf_t *)0x0;
      }
      return (ngx_int_t)cf_local;
    }
    if ((**(size_t **)((long)pvVar2 + n * 8) == (pnVar1->name).len) &&
       (iVar3 = strcmp(*(char **)(*(long *)((long)pvVar2 + n * 8) + 8),(char *)(pnVar1->name).data),
       iVar3 == 0)) break;
    n = n + 1;
  }
  if (*(void **)(*(long *)((long)pvVar2 + n * 8) + 0x48) != pnVar1->data) {
    ngx_conf_log_error(1,cf,0,"the same path name \"%V\" used in %s:%ui and",
                       *(undefined8 *)((long)pvVar2 + n * 8),
                       *(undefined8 *)(*(long *)((long)pvVar2 + n * 8) + 0x50),
                       *(undefined8 *)(*(long *)((long)pvVar2 + n * 8) + 0x58));
    return -1;
  }
  for (path = (ngx_path_t *)0x0; path < (ngx_path_t *)0x3;
      path = (ngx_path_t *)((long)&(path->name).len + 1)) {
    if (*(size_t *)(*(long *)((long)pvVar2 + n * 8) + 0x18 + (long)path * 8) !=
        pnVar1->level[(long)path]) {
      if (pnVar1->conf_file != (u_char *)0x0) {
        ngx_conf_log_error(1,cf,0,
                           "the same path name \"%V\" in %s:%ui has the different levels than",
                           *(undefined8 *)((long)pvVar2 + n * 8),
                           *(undefined8 *)(*(long *)((long)pvVar2 + n * 8) + 0x50),
                           *(undefined8 *)(*(long *)((long)pvVar2 + n * 8) + 0x58));
        return -1;
      }
      if (*(long *)(*(long *)((long)pvVar2 + n * 8) + 0x50) == 0) {
        if (cf->log->log_level != 0) {
          ngx_log_error_core(1,cf->log,0,
                             "the default path name \"%V\" has the same name as another default path, but the different levels, you need to redefine one of them in http section"
                             ,*(undefined8 *)((long)pvVar2 + n * 8));
        }
        return -1;
      }
      if (cf->log->log_level != 0) {
        ngx_log_error_core(1,cf->log,0,
                           "the path name \"%V\" in %s:%ui has the same name as default path, but the different levels, you need to define default path in http section"
                           ,*(undefined8 *)((long)pvVar2 + n * 8),
                           *(undefined8 *)(*(long *)((long)pvVar2 + n * 8) + 0x50),
                           *(undefined8 *)(*(long *)((long)pvVar2 + n * 8) + 0x58));
      }
      return -1;
    }
    if (*(long *)(*(long *)((long)pvVar2 + n * 8) + 0x18 + (long)path * 8) == 0) break;
  }
  *slot = *(ngx_path_t **)((long)pvVar2 + n * 8);
  return 0;
}

Assistant:

ngx_int_t
ngx_add_path(ngx_conf_t *cf, ngx_path_t **slot)
{
    ngx_uint_t   i, n;
    ngx_path_t  *path, **p;

    path = *slot;

    p = cf->cycle->paths.elts;
    for (i = 0; i < cf->cycle->paths.nelts; i++) {
        if (p[i]->name.len == path->name.len
            && ngx_strcmp(p[i]->name.data, path->name.data) == 0)
        {
            if (p[i]->data != path->data) {
                ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                                   "the same path name \"%V\" "
                                   "used in %s:%ui and",
                                   &p[i]->name, p[i]->conf_file, p[i]->line);
                return NGX_ERROR;
            }

            for (n = 0; n < NGX_MAX_PATH_LEVEL; n++) {
                if (p[i]->level[n] != path->level[n]) {
                    if (path->conf_file == NULL) {
                        if (p[i]->conf_file == NULL) {
                            ngx_log_error(NGX_LOG_EMERG, cf->log, 0,
                                      "the default path name \"%V\" has "
                                      "the same name as another default path, "
                                      "but the different levels, you need to "
                                      "redefine one of them in http section",
                                      &p[i]->name);
                            return NGX_ERROR;
                        }

                        ngx_log_error(NGX_LOG_EMERG, cf->log, 0,
                                      "the path name \"%V\" in %s:%ui has "
                                      "the same name as default path, but "
                                      "the different levels, you need to "
                                      "define default path in http section",
                                      &p[i]->name, p[i]->conf_file, p[i]->line);
                        return NGX_ERROR;
                    }

                    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                                      "the same path name \"%V\" in %s:%ui "
                                      "has the different levels than",
                                      &p[i]->name, p[i]->conf_file, p[i]->line);
                    return NGX_ERROR;
                }

                if (p[i]->level[n] == 0) {
                    break;
                }
            }

            *slot = p[i];

            return NGX_OK;
        }
    }

    p = ngx_array_push(&cf->cycle->paths);
    if (p == NULL) {
        return NGX_ERROR;
    }

    *p = path;

    return NGX_OK;
}